

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

WebPIDecoder * NewDecoder(WebPDecBuffer *output_buffer,WebPBitstreamFeatures *features)

{
  WebPDecBuffer *buffer;
  int iVar1;
  WebPIDecoder *pWVar2;
  
  pWVar2 = (WebPIDecoder *)WebPSafeCalloc(1,0x1f0);
  if (pWVar2 == (WebPIDecoder *)0x0) {
    return (WebPIDecoder *)0x0;
  }
  pWVar2->state_ = STATE_WEBP_HEADER;
  pWVar2->chunk_size_ = 0;
  pWVar2->last_mb_y_ = -1;
  (pWVar2->mem_).mode_ = MEM_MODE_NONE;
  (pWVar2->mem_).buf_size_ = 0;
  (pWVar2->mem_).buf_ = (uint8_t *)0x0;
  (pWVar2->mem_).part0_size_ = 0;
  (pWVar2->mem_).part0_buf_ = (uint8_t *)0x0;
  buffer = &pWVar2->output_;
  WebPInitDecBufferInternal(buffer,0x209);
  VP8InitIoInternal(&pWVar2->io_,0x209);
  WebPResetDecParams(&pWVar2->params_);
  if (output_buffer == (WebPDecBuffer *)0x0) {
    (pWVar2->params_).output = buffer;
  }
  else {
    iVar1 = WebPAvoidSlowMemory(output_buffer,features);
    if (iVar1 != 0) {
      (pWVar2->params_).output = buffer;
      pWVar2->final_output_ = output_buffer;
      (pWVar2->output_).colorspace = output_buffer->colorspace;
      goto LAB_0010acce;
    }
    (pWVar2->params_).output = output_buffer;
  }
  pWVar2->final_output_ = (WebPDecBuffer *)0x0;
LAB_0010acce:
  WebPInitCustomIo(&pWVar2->params_,&pWVar2->io_);
  return pWVar2;
}

Assistant:

static WebPIDecoder* NewDecoder(WebPDecBuffer* const output_buffer,
                                const WebPBitstreamFeatures* const features) {
  WebPIDecoder* idec = (WebPIDecoder*)WebPSafeCalloc(1ULL, sizeof(*idec));
  if (idec == NULL) {
    return NULL;
  }

  idec->state_ = STATE_WEBP_HEADER;
  idec->chunk_size_ = 0;

  idec->last_mb_y_ = -1;

  InitMemBuffer(&idec->mem_);
  WebPInitDecBuffer(&idec->output_);
  VP8InitIo(&idec->io_);

  WebPResetDecParams(&idec->params_);
  if (output_buffer == NULL || WebPAvoidSlowMemory(output_buffer, features)) {
    idec->params_.output = &idec->output_;
    idec->final_output_ = output_buffer;
    if (output_buffer != NULL) {
      idec->params_.output->colorspace = output_buffer->colorspace;
    }
  } else {
    idec->params_.output = output_buffer;
    idec->final_output_ = NULL;
  }
  WebPInitCustomIo(&idec->params_, &idec->io_);  // Plug the I/O functions.

  return idec;
}